

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::WriteToLog
          (DataTable *this,DuckTransaction *transaction,WriteAheadLog *log,idx_t row_start,
          idx_t count,optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  int iVar1;
  DataTableInfo *pDVar2;
  DataTableInfo *pDVar3;
  StorageCommitState *pSVar4;
  undefined4 extraout_var;
  PersistentCollectionData *data;
  InternalException *this_00;
  idx_t count_00;
  allocator local_79;
  idx_t local_78;
  idx_t optimistic_count;
  DuckTransaction *local_68;
  optional_ptr<duckdb::PersistentCollectionData,_true> entry;
  optional_ptr<duckdb::StorageCommitState,_true> commit_state_local;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_78 = count;
  local_68 = transaction;
  commit_state_local = commit_state;
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  WriteAheadLog::WriteSetTable(log,&pDVar2->schema,&pDVar3->table);
  count_00 = local_78;
  if (commit_state.ptr != (StorageCommitState *)0x0) {
    optimistic_count = 0;
    pSVar4 = optional_ptr<duckdb::StorageCommitState,_true>::operator->(&commit_state_local);
    iVar1 = (*pSVar4->_vptr_StorageCommitState[5])(pSVar4,this,row_start,&optimistic_count);
    entry.ptr = (PersistentCollectionData *)CONCAT44(extraout_var,iVar1);
    count_00 = local_78;
    if (entry.ptr != (PersistentCollectionData *)0x0) {
      data = optional_ptr<duckdb::PersistentCollectionData,_true>::operator*(&entry);
      WriteAheadLog::WriteRowGroupData(log,data);
      if (local_78 < optimistic_count) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_50._M_pod_data,
                   "Optimistically written count cannot exceed actual count (got %llu, but expected count is %llu)"
                   ,&local_79);
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (this_00,(string *)&local_50,optimistic_count,local_78);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_78 - optimistic_count == 0) {
        return;
      }
      row_start = row_start + optimistic_count;
      count_00 = local_78 - optimistic_count;
    }
  }
  local_50._8_8_ = 0;
  local_38 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/data_table.cpp:1111:50)>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/data_table.cpp:1111:50)>
             ::_M_manager;
  local_50._M_unused._M_object = log;
  ScanTableSegment(this,local_68,row_start,count_00,
                   (function<void_(duckdb::DataChunk_&)> *)&local_50);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void DataTable::WriteToLog(DuckTransaction &transaction, WriteAheadLog &log, idx_t row_start, idx_t count,
                           optional_ptr<StorageCommitState> commit_state) {
	log.WriteSetTable(info->schema, info->table);
	if (commit_state) {
		idx_t optimistic_count = 0;
		auto entry = commit_state->GetRowGroupData(*this, row_start, optimistic_count);
		if (entry) {
			D_ASSERT(optimistic_count > 0);
			log.WriteRowGroupData(*entry);
			if (optimistic_count > count) {
				throw InternalException(
				    "Optimistically written count cannot exceed actual count (got %llu, but expected count is %llu)",
				    optimistic_count, count);
			}
			// write any remaining (non-optimistically written) rows to the WAL normally
			row_start += optimistic_count;
			count -= optimistic_count;
			if (count == 0) {
				return;
			}
		}
	}
	ScanTableSegment(transaction, row_start, count, [&](DataChunk &chunk) { log.WriteInsert(chunk); });
}